

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

value * __thiscall
mjs::object::property::get(value *__return_storage_ptr__,property *this,object *self)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *p;
  object *poVar3;
  bool local_1a2;
  vector<mjs::value,_std::allocator<mjs::value>_> local_148;
  byte local_122;
  byte local_121;
  undefined1 local_120 [56];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_e8;
  value local_d8;
  byte local_a9;
  undefined1 local_a8 [7];
  bool strict;
  undefined1 local_98 [8];
  value g;
  object_ptr a;
  undefined1 local_50 [8];
  value v;
  gc_heap *h;
  object *self_local;
  property *this_local;
  
  v.field_1._24_8_ = object::heap(self);
  raw_get((value *)local_50,this,(gc_heap *)v.field_1._24_8_);
  bVar1 = is_accessor(this);
  if (bVar1) {
    vVar2 = value::type((value *)local_50);
    if (vVar2 != object) {
      __assert_fail("v.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0xe2,"value mjs::object::property::get(const object &) const");
    }
    p = value::object_value((value *)local_50);
    gc_heap_ptr<mjs::object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::object> *)
               &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_,p);
    poVar3 = gc_heap_ptr<mjs::object>::operator->
                       ((gc_heap_ptr<mjs::object> *)
                        &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                         super_gc_heap_ptr_untyped.pos_);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_a8,L"get");
    (**poVar3->_vptr_object)
              (local_98,poVar3,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_a8);
    poVar3 = gc_heap_ptr<mjs::object>::operator->
                       ((gc_heap_ptr<mjs::object> *)
                        &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                         super_gc_heap_ptr_untyped.pos_);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_e8,L"__strict__");
    (**poVar3->_vptr_object)(&local_d8,poVar3,&local_e8);
    bVar1 = value::boolean_value(&local_d8);
    local_1a2 = false;
    if (bVar1) {
      local_1a2 = is_primitive_object(self);
    }
    value::~value(&local_d8);
    local_a9 = local_1a2;
    local_121 = 0;
    local_122 = 0;
    bVar1 = false;
    vVar2 = value::type((value *)local_98);
    if (vVar2 == undefined) {
      value::value(__return_storage_ptr__,(value *)local_98);
    }
    else {
      if ((local_a9 & 1) == 0) {
        gc_heap::unsafe_track<mjs::object>((gc_heap *)local_120,(object *)v.field_1._24_8_);
        local_121 = 1;
        value::value((value *)(local_120 + 0x10),(object_ptr *)local_120);
      }
      else {
        (*self->_vptr_object[4])(local_120 + 0x10);
      }
      local_122 = 1;
      local_148.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_148);
      bVar1 = true;
      call_function(__return_storage_ptr__,(value *)local_98,(value *)(local_120 + 0x10),&local_148)
      ;
    }
    if (bVar1) {
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_148);
    }
    if ((local_122 & 1) != 0) {
      value::~value((value *)(local_120 + 0x10));
    }
    if ((local_121 & 1) != 0) {
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_120);
    }
    value::~value((value *)local_98);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr
              ((gc_heap_ptr<mjs::object> *)
               &g.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_);
  }
  else {
    value::value(__return_storage_ptr__,(value *)local_50);
  }
  value::~value((value *)local_50);
  return __return_storage_ptr__;
}

Assistant:

value object::property::get(const object& self) const {
    auto& h = self.heap();
    auto v = raw_get(h);
    if (is_accessor()) {
        assert(v.type() == value_type::object);
        auto a = v.object_value();
        auto g = a->get(L"get");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        return g.type() != value_type::undefined ? call_function(g, strict ? self.internal_value() : value{h.unsafe_track(self)}, {}) : g;
    }
    return v;
}